

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# index_encoder.c
# Opt level: O0

lzma_ret lzma_index_buffer_encode(lzma_index *i,uint8_t *out,size_t *out_pos,size_t out_size)

{
  size_t sVar1;
  lzma_ret lVar2;
  lzma_vli lVar3;
  lzma_ret ret;
  size_t out_start;
  lzma_index_coder coder;
  size_t out_size_local;
  size_t *out_pos_local;
  uint8_t *out_local;
  lzma_index *i_local;
  
  if ((((i == (lzma_index *)0x0) || (out == (uint8_t *)0x0)) || (out_pos == (size_t *)0x0)) ||
     (out_size < *out_pos)) {
    i_local._4_4_ = LZMA_PROG_ERROR;
  }
  else {
    sVar1 = *out_pos;
    coder._328_8_ = out_size;
    lVar3 = lzma_index_size(i);
    if (out_size - sVar1 < lVar3) {
      i_local._4_4_ = LZMA_BUF_ERROR;
    }
    else {
      index_encoder_reset((lzma_index_coder *)&out_start,i);
      lVar2 = index_encode(&out_start,(lzma_allocator *)0x0,(uint8_t *)0x0,(size_t *)0x0,0,out,
                           out_pos,coder._328_8_,LZMA_RUN);
      if (lVar2 != LZMA_STREAM_END) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Utilities/cmliblzma/liblzma/common/index_encoder.c"
                      ,0xfa,
                      "lzma_ret lzma_index_buffer_encode(const lzma_index *, uint8_t *, size_t *, size_t)"
                     );
      }
      i_local._4_4_ = LZMA_OK;
    }
  }
  return i_local._4_4_;
}

Assistant:

extern LZMA_API(lzma_ret)
lzma_index_buffer_encode(const lzma_index *i,
		uint8_t *out, size_t *out_pos, size_t out_size)
{
	// Validate the arguments.
	if (i == NULL || out == NULL || out_pos == NULL || *out_pos > out_size)
		return LZMA_PROG_ERROR;

	// Don't try to encode if there's not enough output space.
	if (out_size - *out_pos < lzma_index_size(i))
		return LZMA_BUF_ERROR;

	// The Index encoder needs just one small data structure so we can
	// allocate it on stack.
	lzma_index_coder coder;
	index_encoder_reset(&coder, i);

	// Do the actual encoding. This should never fail, but store
	// the original *out_pos just in case.
	const size_t out_start = *out_pos;
	lzma_ret ret = index_encode(&coder, NULL, NULL, NULL, 0,
			out, out_pos, out_size, LZMA_RUN);

	if (ret == LZMA_STREAM_END) {
		ret = LZMA_OK;
	} else {
		// We should never get here, but just in case, restore the
		// output position and set the error accordingly if something
		// goes wrong and debugging isn't enabled.
		assert(0);
		*out_pos = out_start;
		ret = LZMA_PROG_ERROR;
	}

	return ret;
}